

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O3

int runtest(int i)

{
  FILE *__stream;
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  char *pcVar5;
  char *__ptr;
  int *piVar6;
  undefined8 extraout_RDX;
  char *out;
  char *filename;
  ulong uVar7;
  stat buf;
  stat64 sStack_1e8;
  testDesc *ptStack_158;
  stat64 *psStack_150;
  ulong uStack_148;
  code *pcStack_140;
  long local_130;
  int local_128;
  int local_124;
  int local_120;
  int local_11c;
  long local_118;
  char *local_110;
  glob64_t local_108;
  stat64 local_c0;
  
  local_11c = nb_errors;
  local_124 = nb_tests;
  local_120 = nb_leaks;
  if ((tests_quiet == '\0') && (testDescriptions[i].desc != (char *)0x0)) {
    pcStack_140 = (code *)0x10753d;
    printf("## %s\n");
  }
  pcStack_140 = (code *)0x107556;
  lVar4 = xmlGetCharEncodingHandler(6);
  pcStack_140 = (code *)0x107563;
  local_118 = xmlGetCharEncodingHandler(0x15);
  if (testDescriptions[i].in == (char *)0x0) {
    testErrorsSize = 0;
    testErrors[0] = '\0';
    extraMemoryFromResolver = 0;
    pcStack_140 = (code *)0x1077d2;
    iVar1 = (*testDescriptions[i].func)
                      ((char *)0x0,(char *)0x0,(char *)0x0,testDescriptions[i].options);
    if (iVar1 != 0) {
      nb_errors = nb_errors + 1;
    }
  }
  else {
    local_108.gl_offs = 0;
    pcStack_140 = (code *)0x107592;
    glob64(testDescriptions[i].in,8,(__errfunc *)0x0,&local_108);
    if (local_108.gl_pathc != 0) {
      local_128 = 0;
      uVar7 = 0;
      local_130 = lVar4;
      do {
        pcStack_140 = (code *)0x1075c7;
        iVar1 = stat64(local_108.gl_pathv[uVar7],&local_c0);
        if ((iVar1 != -1) && ((local_c0.st_mode & 0xf000) == 0x8000)) {
          if (lVar4 == 0) {
            pcStack_140 = (code *)0x10762e;
            pcVar5 = strstr(local_108.gl_pathv[uVar7],"ebcdic");
            if (pcVar5 != (char *)0x0) goto LAB_0010771c;
          }
          if (local_118 == 0) {
            pcStack_140 = (code *)0x10764e;
            pcVar5 = strstr(local_108.gl_pathv[uVar7],"icu_parse_test");
            if (pcVar5 != (char *)0x0) goto LAB_0010771c;
          }
          if (testDescriptions[i].suffix == (char *)0x0) {
            pcVar5 = (char *)0x0;
          }
          else {
            filename = local_108.gl_pathv[uVar7];
            out = testDescriptions[i].out;
            pcStack_140 = (code *)0x10760c;
            pcVar5 = resultFilename(filename,out,testDescriptions[i].suffix);
            if (pcVar5 == (char *)0x0) {
              pcStack_140 = (code *)0x107860;
              runtest_cold_1();
              goto LAB_00107860;
            }
          }
          if (testDescriptions[i].err == (char *)0x0) {
            __ptr = (char *)0x0;
          }
          else {
            filename = local_108.gl_pathv[uVar7];
            out = testDescriptions[i].out;
            pcStack_140 = (code *)0x107676;
            __ptr = resultFilename(filename,out,testDescriptions[i].err);
            if (__ptr == (char *)0x0) {
LAB_00107860:
              pcStack_140 = testExternalEntityLoader;
              runtest_cold_2();
              ptStack_158 = testDescriptions + i;
              psStack_150 = &local_c0;
              uStack_148 = uVar7;
              pcStack_140 = (code *)pcVar5;
              iVar1 = stat64(filename,&sStack_1e8);
              if ((iVar1 != -1) && ((sStack_1e8.st_mode & 0xf000) == 0x8000)) {
                iVar1 = xmlNoNetExternalEntityLoader(filename,out,extraout_RDX);
                return iVar1;
              }
              iVar1 = xmlMemUsed();
              iVar2 = xmlNoNetExternalEntityLoader(filename,out,extraout_RDX);
              iVar3 = xmlMemUsed();
              extraMemoryFromResolver = extraMemoryFromResolver + (iVar3 - iVar1);
              return iVar2;
            }
          }
          pcStack_140 = (code *)0x10768b;
          iVar1 = xmlMemUsed();
          extraMemoryFromResolver = 0;
          testErrorsSize = 0;
          testErrors[0] = '\0';
          pcStack_140 = (code *)0x1076bf;
          iVar2 = (*testDescriptions[i].func)
                            (local_108.gl_pathv[uVar7],pcVar5,__ptr,
                             testDescriptions[i].options | 0x10000);
          pcStack_140 = (code *)0x1076c7;
          xmlResetLastError();
          if (iVar2 == 0) {
            pcStack_140 = (code *)0x1076d1;
            iVar2 = xmlMemUsed();
            if (iVar2 != iVar1) {
              pcStack_140 = (code *)0x1076db;
              iVar2 = xmlMemUsed();
              __stream = _stderr;
              if ((iVar2 != iVar1) && (extraMemoryFromResolver == 0)) {
                local_110 = local_108.gl_pathv[uVar7];
                pcStack_140 = (code *)0x107773;
                iVar2 = xmlMemUsed();
                pcStack_140 = (code *)0x10778e;
                fprintf(__stream,"File %s leaked %d bytes\n",local_110,(ulong)(uint)(iVar2 - iVar1))
                ;
                piVar6 = &nb_leaks;
                goto LAB_00107795;
              }
            }
          }
          else {
            pcStack_140 = (code *)0x10774d;
            fprintf(_stderr,"File %s generated an error\n",local_108.gl_pathv[uVar7]);
            piVar6 = &nb_errors;
LAB_00107795:
            *piVar6 = *piVar6 + 1;
            local_128 = local_128 + 1;
          }
          lVar4 = local_130;
          testErrorsSize = 0;
          if (pcVar5 != (char *)0x0) {
            pcStack_140 = (code *)0x107705;
            free(pcVar5);
          }
          if (__ptr != (char *)0x0) {
            pcStack_140 = (code *)0x107712;
            free(__ptr);
          }
        }
LAB_0010771c:
        uVar7 = uVar7 + 1;
      } while (uVar7 < local_108.gl_pathc);
    }
    pcStack_140 = (code *)0x1077af;
    globfree64(&local_108);
  }
  pcStack_140 = (code *)0x1077e4;
  xmlCharEncCloseFunc(lVar4);
  pcStack_140 = (code *)0x1077ee;
  iVar1 = xmlCharEncCloseFunc(local_118);
  if (verbose == '\x01') {
    if (nb_leaks == local_120 && nb_errors == local_11c) {
      pcStack_140 = (code *)0x107833;
      iVar1 = printf("Ran %d tests, no errors\n",(ulong)(uint)(nb_tests - local_124));
    }
    else {
      pcStack_140 = (code *)0x107849;
      iVar1 = printf("Ran %d tests, %d errors, %d leaks\n",(ulong)(uint)(nb_tests - local_124),
                     (ulong)(uint)(nb_errors - local_11c),(ulong)(uint)(nb_leaks - local_120));
    }
  }
  return iVar1;
}

Assistant:

static int
runtest(int i) {
    int ret = 0, res;
    int old_errors, old_tests, old_leaks;

    old_errors = nb_errors;
    old_tests = nb_tests;
    old_leaks = nb_leaks;
    if ((tests_quiet == 0) && (testDescriptions[i].desc != NULL))
	printf("## %s\n", testDescriptions[i].desc);
    res = launchTests(&testDescriptions[i]);
    if (res != 0)
	ret++;
    if (verbose) {
	if ((nb_errors == old_errors) && (nb_leaks == old_leaks))
	    printf("Ran %d tests, no errors\n", nb_tests - old_tests);
	else
	    printf("Ran %d tests, %d errors, %d leaks\n",
		   nb_tests - old_tests,
		   nb_errors - old_errors,
		   nb_leaks - old_leaks);
    }
    return(ret);
}